

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  ImDrawList *this;
  ImGuiTabItem *tab;
  int tab_n;
  uint i;
  int iVar6;
  undefined8 uVar7;
  ImVec2 local_148;
  ImVec2 local_140;
  char buf [256];
  
  iVar1 = tab_bar->PrevFrameVisible;
  iVar6 = GImGui->FrameCount + -2;
  pcVar5 = " *Inactive*";
  if (iVar6 <= iVar1) {
    pcVar5 = "";
  }
  ImFormatString(buf,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                 (ulong)(uint)(tab_bar->Tabs).Size,pcVar5);
  if (iVar1 < iVar6) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar3 = TreeNode(label,"%s",buf);
  if (iVar1 < iVar6) {
    PopStyleColor(1);
  }
  else {
    bVar4 = IsItemHovered(0);
    if (bVar4) {
      this = GetForegroundDrawList();
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar3) {
    for (i = 0; (int)i < (tab_bar->Tabs).Size; i = i + 1) {
      tab = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i);
      PushID(tab);
      bVar3 = SmallButton("<");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,tab,-1);
      }
      SameLine(0.0,2.0);
      bVar3 = SmallButton(">");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,tab,1);
      }
      SameLine(0.0,-1.0);
      uVar2 = tab->ID;
      uVar7 = 0x2a;
      if (uVar2 != tab_bar->SelectedTabId) {
        uVar7 = 0x20;
      }
      pcVar5 = "";
      if (tab->NameOffset != -1) {
        pcVar5 = ImGuiTabBar::GetTabName(tab_bar,tab);
      }
      Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",(double)tab->Offset,
           (double)tab->Width,(double)tab->ContentWidth,(ulong)i,uVar7,(ulong)uVar2,pcVar5);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    IM_UNUSED(p);
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}